

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O1

int kvtree_elem_delete(kvtree_elem *elem)

{
  int in_EAX;
  int extraout_EAX;
  void *in_RDI;
  void *local_10;
  
  if (in_RDI != (void *)0x0) {
    local_10 = in_RDI;
    kvtree_free(in_RDI);
    kvtree_delete((kvtree **)((long)local_10 + 8));
    *(undefined8 *)((long)local_10 + 8) = 0;
    kvtree_free(&local_10);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

static int kvtree_elem_delete(kvtree_elem* elem)
{
  if (elem != NULL) {
    /* free the key which was strdup'ed */
    kvtree_free(&(elem->key));

    /* free the hash */
    kvtree_delete(&elem->hash);
    elem->hash = NULL;

    /* finally, free the element structure itself */
    kvtree_free(&elem);
  }
  return KVTREE_SUCCESS;
}